

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  char *format_00;
  ImGuiContext *g;
  ImGuiInputTextFlags flags;
  ImVec2 local_80;
  char data_buf [32];
  char fmt_buf [32];
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  SetActiveID(pIVar3->ScalarAsInputTextId,window);
  pIVar3->ActiveIdAllowNavDirFlags = 0xc;
  pIVar4 = GImGui;
  GImGui->HoveredId = 0;
  pIVar4->HoveredIdAllowOverlap = false;
  pIVar4->HoveredIdTimer = 0.0;
  uVar1 = window->FocusIdxAllCounter;
  uVar2 = window->FocusIdxTabCounter;
  window->FocusIdxAllCounter = uVar1 + -1;
  window->FocusIdxTabCounter = uVar2 + -1;
  format_00 = ImParseFormatTrimDecorations(format,fmt_buf,0x20);
  DataTypeFormatString(data_buf,0x20,data_type,data_ptr,format_00);
  ImStrTrimBlanks(data_buf);
  flags = 0x11;
  if ((data_type & 0xfffffffeU) == 4) {
    flags = 0x20010;
  }
  local_80.x = (bb->Max).x - (bb->Min).x;
  local_80.y = (bb->Max).y - (bb->Min).y;
  bVar5 = InputTextEx(label,data_buf,0x20,&local_80,flags,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if (pIVar3->ScalarAsInputTextId == 0) {
    if (pIVar3->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x2217,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar3->ScalarAsInputTextId = id;
    SetHoveredID(id);
  }
  if (bVar5) {
    bVar5 = DataTypeApplyOpFromText
                      (data_buf,(pIVar3->InputTextState).InitialText.Data,data_type,data_ptr,
                       (char *)0x0);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImStrTrimBlanks(data_buf);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}